

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

double duckdb::ApproxQuantileCoding::Encode<duckdb::hugeint_t,double>(hugeint_t *input)

{
  duckdb *this;
  uint64_t uVar1;
  bool bVar2;
  InvalidInputException *this_00;
  int64_t iVar3;
  hugeint_t input_00;
  double result;
  double local_48;
  string local_40;
  
  this = (duckdb *)input->lower;
  uVar1 = input->upper;
  iVar3 = 0;
  bVar2 = duckdb::TryCast::Operation<duckdb::hugeint_t,double>(*input,&local_48,false);
  if (bVar2) {
    return local_48;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar3;
  input_00.lower = uVar1;
  CastExceptionText<duckdb::hugeint_t,double>(&local_40,this,input_00);
  duckdb::InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static SAVE_TYPE Encode(const INPUT_TYPE &input) {
		return Cast::template Operation<INPUT_TYPE, SAVE_TYPE>(input);
	}